

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::detail::FormatArg::formatImpl<char[12]>
               (ostream *out,char *fmtBegin,char *fmtEnd,int ntrunc,void *value)

{
  if (fmtEnd[-1] == 'p') {
    std::ostream::_M_insert<void_const*>(out);
    return;
  }
  if (-1 < ntrunc) {
    formatTruncated(out,(char *)value,ntrunc);
    return;
  }
  std::operator<<(out,(char *)value);
  return;
}

Assistant:

TINYFORMAT_HIDDEN static void formatImpl(std::ostream& out, const char* fmtBegin,
                        const char* fmtEnd, int ntrunc, const void* value)
        {
            formatValue(out, fmtBegin, fmtEnd, ntrunc, *static_cast<const T*>(value));
        }